

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O3

Ref<embree::SceneGraph::Node> __thiscall
embree::SceneGraph::convert_triangles_to_quads
          (SceneGraph *this,Ref<embree::SceneGraph::Node> *node,float prop)

{
  Node *pNVar1;
  long *plVar2;
  int iVar3;
  long *plVar4;
  long lVar5;
  TriangleMeshNode *pTVar6;
  ulong uVar7;
  long local_58;
  Ref<embree::SceneGraph::Node> local_50;
  Ref<embree::SceneGraph::Node> local_48;
  Ref<embree::SceneGraph::Node> local_40;
  Ref<embree::SceneGraph::TriangleMeshNode> local_38;
  
  pNVar1 = node->ptr;
  if (pNVar1 != (Node *)0x0) {
    plVar4 = (long *)__dynamic_cast(pNVar1,&Node::typeinfo,&TransformNode::typeinfo,0);
    if (plVar4 == (long *)0x0) {
      plVar4 = (long *)__dynamic_cast(pNVar1,&Node::typeinfo,&MultiTransformNode::typeinfo,0);
      if (plVar4 == (long *)0x0) {
        plVar4 = (long *)__dynamic_cast(pNVar1,&Node::typeinfo,&GroupNode::typeinfo,0);
        if (plVar4 == (long *)0x0) {
          pTVar6 = (TriangleMeshNode *)
                   __dynamic_cast(pNVar1,&Node::typeinfo,&TriangleMeshNode::typeinfo,0);
          if (pTVar6 != (TriangleMeshNode *)0x0) {
            (*(pTVar6->super_Node).super_RefCount._vptr_RefCount[2])(pTVar6);
            iVar3 = rand();
            if ((float)iVar3 * 4.656613e-10 <= prop) {
              local_38.ptr = pTVar6;
              (*(pTVar6->super_Node).super_RefCount._vptr_RefCount[2])(pTVar6);
              convert_triangles_to_quads(this,&local_38);
              (*(pTVar6->super_Node).super_RefCount._vptr_RefCount[3])(pTVar6);
            }
            else {
              *(Node **)this = node->ptr;
              node->ptr = (Node *)0x0;
            }
            (*(pTVar6->super_Node).super_RefCount._vptr_RefCount[3])(pTVar6);
            return (Ref<embree::SceneGraph::Node>)(Node *)this;
          }
        }
        else {
          (**(code **)(*plVar4 + 0x10))(plVar4);
          lVar5 = plVar4[0xd];
          if (plVar4[0xe] != lVar5) {
            uVar7 = 0;
            do {
              local_50.ptr = *(Node **)(lVar5 + uVar7 * 8);
              if (local_50.ptr != (Node *)0x0) {
                (*((local_50.ptr)->super_RefCount)._vptr_RefCount[2])();
              }
              convert_triangles_to_quads((SceneGraph *)&local_58,&local_50,prop);
              lVar5 = plVar4[0xd];
              plVar2 = *(long **)(lVar5 + uVar7 * 8);
              if (plVar2 != (long *)0x0) {
                (**(code **)(*plVar2 + 0x18))();
              }
              *(long *)(lVar5 + uVar7 * 8) = local_58;
              if (local_50.ptr != (Node *)0x0) {
                (*((local_50.ptr)->super_RefCount)._vptr_RefCount[3])();
              }
              uVar7 = uVar7 + 1;
              lVar5 = plVar4[0xd];
            } while (uVar7 < (ulong)(plVar4[0xe] - lVar5 >> 3));
          }
          (**(code **)(*plVar4 + 0x18))(plVar4);
        }
      }
      else {
        (**(code **)(*plVar4 + 0x10))(plVar4);
        local_48.ptr = (Node *)plVar4[0x10];
        if (local_48.ptr != (Node *)0x0) {
          (*((local_48.ptr)->super_RefCount)._vptr_RefCount[2])();
        }
        convert_triangles_to_quads((SceneGraph *)&local_58,&local_48,prop);
        if ((long *)plVar4[0x10] != (long *)0x0) {
          (**(code **)(*(long *)plVar4[0x10] + 0x18))();
        }
        plVar4[0x10] = local_58;
        if (local_48.ptr != (Node *)0x0) {
          (*((local_48.ptr)->super_RefCount)._vptr_RefCount[3])();
        }
        (**(code **)(*plVar4 + 0x18))(plVar4);
      }
    }
    else {
      (**(code **)(*plVar4 + 0x10))(plVar4);
      local_40.ptr = (Node *)plVar4[0x13];
      if (local_40.ptr != (Node *)0x0) {
        (*((local_40.ptr)->super_RefCount)._vptr_RefCount[2])();
      }
      convert_triangles_to_quads((SceneGraph *)&local_58,&local_40,prop);
      if ((long *)plVar4[0x13] != (long *)0x0) {
        (**(code **)(*(long *)plVar4[0x13] + 0x18))();
      }
      plVar4[0x13] = local_58;
      if (local_40.ptr != (Node *)0x0) {
        (*((local_40.ptr)->super_RefCount)._vptr_RefCount[3])();
      }
      (**(code **)(*plVar4 + 0x18))(plVar4);
    }
  }
  *(Node **)this = node->ptr;
  node->ptr = (Node *)0x0;
  return (Ref<embree::SceneGraph::Node>)(Node *)this;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::convert_triangles_to_quads(Ref<SceneGraph::Node> node, float prop)
  {
    if (Ref<SceneGraph::TransformNode> xfmNode = node.dynamicCast<SceneGraph::TransformNode>()) {
      xfmNode->child = convert_triangles_to_quads(xfmNode->child,prop);
    } 
    else if (Ref<SceneGraph::MultiTransformNode> xfmNode = node.dynamicCast<SceneGraph::MultiTransformNode>()) {
      xfmNode->child = convert_triangles_to_quads(xfmNode->child,prop);
    }
    else if (Ref<SceneGraph::GroupNode> groupNode = node.dynamicCast<SceneGraph::GroupNode>()) 
    {
      for (size_t i=0; i<groupNode->children.size(); i++) 
        groupNode->children[i] = convert_triangles_to_quads(groupNode->children[i],prop);
    }
    else if (Ref<SceneGraph::TriangleMeshNode> tmesh = node.dynamicCast<SceneGraph::TriangleMeshNode>()) {
      if (random<float>() <= prop) return convert_triangles_to_quads(tmesh);
      else                         return node;
    }
    return node;
  }